

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

double __thiscall Graph::evaluateLossesAndFlows(Graph *this,double tol,int idLoadFactorGlobal)

{
  double *pdVar1;
  undefined4 local_3c;
  double dStack_38;
  int it;
  double error;
  double *current_total_loss;
  double *last_total_loss;
  int idLoadFactorGlobal_local;
  double tol_local;
  Graph *this_local;
  
  resetFlowAndLoss(this);
  dStack_38 = 1.0;
  Vertex::idLF = idLoadFactorGlobal;
  current_total_loss = getLosses(this);
  local_3c = 0;
  while (tol < dStack_38) {
    forward(this,local_3c);
    backward(this);
    pdVar1 = getLosses(this);
    dStack_38 = *pdVar1 - *current_total_loss;
    if (current_total_loss != (double *)0x0) {
      operator_delete(current_total_loss,8);
    }
    local_3c = local_3c + 1;
    current_total_loss = pdVar1;
  }
  pdVar1 = getLosses(this);
  return *pdVar1;
}

Assistant:

double Graph::evaluateLossesAndFlows(double tol, int idLoadFactorGlobal){
    this->resetFlowAndLoss();
    Vertex::idLF = idLoadFactorGlobal; /// Static Param. Muda rede toda

    double *last_total_loss, *current_total_loss , error = 1.0;

    last_total_loss = this->getLosses();
    for( int it = 0; error>tol; it++ ){
        forward(it);        // Calcula fluxos de potencia nas linhas
        backward();         // Calcula voltagem nas barras e perdas nas linhas

        current_total_loss = this->getLosses();
        error = current_total_loss[0] - last_total_loss[0];
        delete last_total_loss;

        last_total_loss = current_total_loss;
    }
    return this->getLosses()[0];
}